

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> * __thiscall
Parser::parseFunctionDeclarationExpression
          (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  int iVar1;
  undefined1 auVar2 [8];
  pointer psVar3;
  char cVar4;
  void *pvVar5;
  optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *poVar6;
  TokenType type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar7;
  undefined1 *puVar8;
  undefined1 local_128 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  undefined1 local_108 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  undefined1 local_e8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  undefined1 local_a8 [24];
  vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> parameters;
  undefined1 auStack_78 [8];
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  size_type __dnew_5;
  optional<std::shared_ptr<StatementAstNode>_> statement;
  char local_31;
  bool error;
  
  local_31 = '\0';
  local_a8._16_8_ = (ostream *)0x0;
  parameters.super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar8 = (undefined1 *)
           ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8);
  auStack_78 = (undefined1  [8])0x31;
  parameters.super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  __dnew_5 = (size_type)puVar8;
  __dnew_5 = std::__cxx11::string::_M_create(&__dnew_5,(ulong)auStack_78);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)auStack_78;
  builtin_strncpy((char *)__dnew_5,"Expected function keyword for function definition",0x31);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_78;
  *(char *)(__dnew_5 + (long)auStack_78) = '\0';
  type = (TokenType)this;
  expect((Parser *)local_128,type,(bool *)0x9,(string *)&local_31);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
  }
  if ((undefined1 *)__dnew_5 != puVar8) {
    operator_delete((void *)__dnew_5,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  skipWhiteSpace(this);
  auStack_78 = (undefined1  [8])0x31;
  __dnew_5 = (size_type)puVar8;
  __dnew_5 = std::__cxx11::string::_M_create(&__dnew_5,(ulong)auStack_78);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)auStack_78;
  builtin_strncpy((char *)__dnew_5,"Expected left paren following function definition",0x31);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_78;
  *(char *)(__dnew_5 + (long)auStack_78) = '\0';
  expect((Parser *)(local_128 + 0x10),type,(bool *)0x5,(string *)&local_31);
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if ((undefined1 *)__dnew_5 != puVar8) {
    operator_delete((void *)__dnew_5,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  do {
    puVar8 = (undefined1 *)
             ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                     super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8
             );
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)&__dnew_5);
    iVar1 = *(int *)(__dnew_5 + 0x20);
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar1 == 1) {
      auStack_78 = (undefined1  [8])0x45;
      __dnew_5 = (size_type)puVar8;
      pvVar5 = (void *)std::__cxx11::string::_M_create(&__dnew_5,(ulong)auStack_78);
      auVar2 = auStack_78;
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)auStack_78;
      __dnew_5 = (size_type)pvVar5;
      memcpy(pvVar5,"Expected a right paren to close parameter list of function definition",0x45);
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)auVar2;
      *(undefined1 *)((long)pvVar5 + (long)auVar2) = 0;
      expect((Parser *)local_108,type,(bool *)0x6,(string *)&local_31);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      }
      poVar6 = (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
               parameters.
               super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((undefined1 *)__dnew_5 !=
          (undefined1 *)
          ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8))
      {
        operator_delete((void *)__dnew_5,
                        (long)statement.
                              super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                              .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                              _M_payload._M_value.
                              super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 1);
      }
      *(undefined1 *)
       &(((pointer)((long)poVar6 + 0x10))->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = 0;
      goto LAB_0010d1fc;
    }
    TokenBuffer::currentToken((TokenBuffer *)&__dnew_5);
    iVar1 = *(int *)(__dnew_5 + 0x20);
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar1 == 6) {
      auStack_78 = (undefined1  [8])0x45;
      __dnew_5 = (size_type)puVar8;
      pvVar5 = (void *)std::__cxx11::string::_M_create(&__dnew_5,(ulong)auStack_78);
      auVar2 = auStack_78;
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)auStack_78;
      __dnew_5 = (size_type)pvVar5;
      memcpy(pvVar5,"Expected a right paren to close parameter list of function definition",0x45);
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)auVar2;
      *(undefined1 *)((long)pvVar5 + (long)auVar2) = 0;
      expect((Parser *)(local_108 + 0x10),type,(bool *)0x6,(string *)&local_31);
      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
      }
      if ((undefined1 *)__dnew_5 !=
          (undefined1 *)
          ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8))
      {
        operator_delete((void *)__dnew_5,
                        (long)statement.
                              super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                              .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                              _M_payload._M_value.
                              super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 1);
      }
      break;
    }
    auStack_78 = (undefined1  [8])0x37;
    __dnew_5 = (size_type)puVar8;
    __dnew_5 = std::__cxx11::string::_M_create((ulong *)&__dnew_5,(ulong)auStack_78);
    statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)auStack_78;
    builtin_strncpy((char *)__dnew_5,"Expected identifier as parameter of function definition",0x37)
    ;
    statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auStack_78;
    *(char *)(__dnew_5 + (long)auStack_78) = '\0';
    expect((Parser *)auStack_78,type,(bool *)0x18,(string *)&local_31);
    if ((undefined1 *)__dnew_5 != puVar8) {
      operator_delete((void *)__dnew_5,
                      (long)statement.
                            super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                            _M_payload._M_value.
                            super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 1);
    }
    skipWhiteSpace(this);
    if (*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)auStack_78 + 0x20))->_M_pi ==
        0x18) {
      std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::push_back
                ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                 (local_a8 + 0x10),(value_type *)auStack_78);
    }
    else {
      local_31 = '\x01';
    }
    TokenBuffer::currentToken((TokenBuffer *)&__dnew_5);
    iVar1 = *(int *)(__dnew_5 + 0x20);
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar1 == 6) {
      statements.
      super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x45;
      __dnew_5 = (size_type)puVar8;
      pvVar5 = (void *)std::__cxx11::string::_M_create
                                 ((ulong *)&__dnew_5,
                                  (ulong)&statements.
                                          super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      psVar3 = statements.
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           statements.
           super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __dnew_5 = (size_type)pvVar5;
      memcpy(pvVar5,"Expected a right paren to close parameter list of function definition",0x45);
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)psVar3;
      *(undefined1 *)((long)pvVar5 + (long)psVar3) = 0;
      expect((Parser *)(local_c8 + 0x10),type,(bool *)0x6,(string *)&local_31);
      this_00 = local_b0;
    }
    else {
      statements.
      super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x43;
      __dnew_5 = (size_type)puVar8;
      pvVar5 = (void *)std::__cxx11::string::_M_create
                                 ((ulong *)&__dnew_5,
                                  (ulong)&statements.
                                          super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      psVar3 = statements.
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           statements.
           super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __dnew_5 = (size_type)pvVar5;
      memcpy(pvVar5,"Expected a comma between function parameters in function definition",0x43);
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)psVar3;
      *(undefined1 *)((long)pvVar5 + (long)psVar3) = 0;
      expect((Parser *)local_a8,type,(bool *)0x13,(string *)&local_31);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((undefined1 *)__dnew_5 !=
        (undefined1 *)
        ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8)) {
      operator_delete((void *)__dnew_5,
                      (long)statement.
                            super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                            _M_payload._M_value.
                            super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 1);
    }
    if (statements.
        super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statements.
                 super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
  } while (iVar1 != 6);
  skipWhiteSpace(this);
  auStack_78 = (undefined1  [8])0x43;
  __dnew_5 = (size_type)
             ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                     super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8
             );
  pvVar5 = (void *)std::__cxx11::string::_M_create(&__dnew_5,(ulong)auStack_78);
  auVar2 = auStack_78;
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)auStack_78;
  __dnew_5 = (size_type)pvVar5;
  memcpy(pvVar5,"Expected left curly bracket after to begin function body definition",0x43);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)auVar2;
  *(undefined1 *)((long)pvVar5 + (long)auVar2) = 0;
  expect((Parser *)local_e8,type,(bool *)0x2,(string *)&local_31);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  if ((undefined1 *)__dnew_5 !=
      (undefined1 *)
      ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8)) {
    operator_delete((void *)__dnew_5,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  auStack_78 = (undefined1  [8])0x0;
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar7 = local_31;
  while( true ) {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)&__dnew_5);
    iVar1 = *(int *)(__dnew_5 + 0x20);
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar1 == 1) {
      puVar8 = (undefined1 *)
               ((long)&statement.
                       super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                       .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload
               + 8);
      statements.
      super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x39;
      __dnew_5 = (size_type)puVar8;
      local_31 = cVar7;
      __dnew_5 = std::__cxx11::string::_M_create
                           (&__dnew_5,
                            (ulong)&statements.
                                    super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           statements.
           super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      builtin_strncpy((char *)__dnew_5,"Expected a right curly bracket to end function definition",
                      0x39);
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           statements.
           super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(char *)(__dnew_5 +
               (long)statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) = '\0';
      expect((Parser *)(local_e8 + 0x10),type,(bool *)0x3,(string *)&local_31);
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      }
      poVar6 = (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
               parameters.
               super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((undefined1 *)__dnew_5 != puVar8) {
        operator_delete((void *)__dnew_5,
                        (long)statement.
                              super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                              .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                              _M_payload._M_value.
                              super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 1);
      }
      goto LAB_0010d1b2;
    }
    TokenBuffer::currentToken((TokenBuffer *)&__dnew_5);
    iVar1 = *(int *)(__dnew_5 + 0x20);
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar1 == 3) break;
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)&__dnew_5,this);
    cVar4 = '\x01';
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01')
    {
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   *)auStack_78,(value_type *)&__dnew_5);
      cVar4 = cVar7;
    }
    cVar7 = cVar4;
    if (((statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload
          .super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
          super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ & 1) !=
         0) && (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value
                .super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = (__shared_count<(__gnu_cxx::_Lock_policy)2>)
                       ((ulong)statement.
                               super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                               .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                               _M_payload._M_value.
                               super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi & 0xffffffffffffff00),
               statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
               _M_payload.
               super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
               super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
               super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  puVar8 = (undefined1 *)
           ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8);
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x39;
  __dnew_5 = (size_type)puVar8;
  local_31 = cVar7;
  __dnew_5 = std::__cxx11::string::_M_create
                       (&__dnew_5,
                        (ulong)&statements.
                                super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       statements.
       super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  builtin_strncpy((char *)__dnew_5,"Expected a right curly bracket to end function definition",0x39)
  ;
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       statements.
       super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(char *)(__dnew_5 +
           (long)statements.
                 super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) = '\0';
  expect((Parser *)local_c8,type,(bool *)0x3,(string *)&local_31);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if ((undefined1 *)__dnew_5 != puVar8) {
    operator_delete((void *)__dnew_5,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  poVar6 = (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
           parameters.
           super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (local_31 == '\0') {
    __dnew_5 = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<FunctionDeclarationExpressionAstNode,std::allocator<FunctionDeclarationExpressionAstNode>,std::vector<std::shared_ptr<Token>,std::allocator<std::shared_ptr<Token>>>&,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement,
               (FunctionDeclarationExpressionAstNode **)&__dnew_5,
               (_Sp_alloc_shared_tag<std::allocator<FunctionDeclarationExpressionAstNode>_>)
               &statements.
                super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
               (local_a8 + 0x10),
               (vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                *)auStack_78);
    ((parameters.
      super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage)->
    super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)__dnew_5;
    ((parameters.
      super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage)->
    super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
         super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
         super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(undefined1 *)
     &parameters.
      super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[1].
      super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
    poVar6 = (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
             parameters.
             super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
LAB_0010d1b2:
    (poVar6->
    super__Optional_base<std::shared_ptr<FunctionDeclarationExpressionAstNode>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::shared_ptr<FunctionDeclarationExpressionAstNode>,_true,_false,_false>
    .super__Optional_payload_base<std::shared_ptr<FunctionDeclarationExpressionAstNode>_>._M_engaged
         = false;
  }
  std::
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>::
  ~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           *)auStack_78);
LAB_0010d1fc:
  std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::~vector
            ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
             (local_a8 + 0x10));
  return poVar6;
}

Assistant:

const std::optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>>
Parser::parseFunctionDeclarationExpression() noexcept {
  bool error = false;
  std::vector<std::shared_ptr<Token>> parameters;

  this->expect(TokenType::Function, error, "Expected function keyword for function definition");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected left paren following function definition");

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      break;
    }

    auto token = this->expect(TokenType::Identifier, error,
      "Expected identifier as parameter of function definition");

    this->skipWhiteSpace();

    if (token->tokenType != TokenType::Identifier) {
      error = true;

    } else {
      parameters.push_back(token);
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      break;
    }

    this->expect(TokenType::Comma, error,
      "Expected a comma between function parameters in function definition");
  }

  this->skipWhiteSpace();

  this->expect(TokenType::LeftCurly, error,
    "Expected left curly bracket after to begin function body definition");

  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end function definition");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end function definition");
      break;
    }

    auto statement = this->parseStatement();

    if (!statement) {
      error = true;

    } else {
      statements.push_back(statement.value());
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<FunctionDeclarationExpressionAstNode>(parameters, statements);
}